

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

uint32_t trico_get_number_of_uvs(void *a)

{
  int iVar1;
  uint32_t local_24;
  void *pvStack_20;
  uint32_t nr_uvs;
  trico_archive *arch;
  void *a_local;
  
  if ((((*(int *)((long)a + 0x24) == 5) || (*(int *)((long)a + 0x24) == 6)) ||
      (*(int *)((long)a + 0x24) == 7)) || (*(int *)((long)a + 0x24) == 8)) {
    pvStack_20 = a;
    arch = (trico_archive *)a;
    iVar1 = read_inplace(&local_24,4,1,(trico_archive *)a);
    if (iVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = local_24;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

uint32_t trico_get_number_of_uvs(void* a)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (arch->next_stream_type == trico_uv_per_vertex_float_stream || arch->next_stream_type == trico_uv_per_vertex_double_stream ||
    arch->next_stream_type == trico_uv_per_triangle_float_stream || arch->next_stream_type == trico_uv_per_triangle_double_stream)
    {
    uint32_t nr_uvs;
    if (!read_inplace(&nr_uvs, sizeof(uint32_t), 1, arch))
      return 0;
    return nr_uvs;
    }
  return 0;
  }